

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binaryen-c.cpp
# Opt level: O2

BinaryenType
TypeBuilderGetTempTupleType(TypeBuilderRef builder,BinaryenType *types,BinaryenIndex numTypes)

{
  BinaryenIndex cur;
  ulong uVar1;
  Type TVar2;
  undefined1 local_58 [8];
  TypeList typeList;
  
  std::vector<wasm::Type,_std::allocator<wasm::Type>_>::vector
            ((vector<wasm::Type,_std::allocator<wasm::Type>_> *)local_58,(ulong)numTypes,
             (allocator_type *)
             &typeList.super__Vector_base<wasm::Type,_std::allocator<wasm::Type>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage);
  for (uVar1 = 0; numTypes != uVar1; uVar1 = uVar1 + 1) {
    ((pointer)((long)local_58 + uVar1 * 8))->id = types[uVar1];
  }
  std::vector<wasm::Type,_std::allocator<wasm::Type>_>::vector
            ((vector<wasm::Type,_std::allocator<wasm::Type>_> *)
             &typeList.super__Vector_base<wasm::Type,_std::allocator<wasm::Type>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage,
             (vector<wasm::Type,_std::allocator<wasm::Type>_> *)local_58);
  TVar2 = wasm::TypeBuilder::getTempTupleType
                    (builder,(Tuple *)&typeList.
                                       super__Vector_base<wasm::Type,_std::allocator<wasm::Type>_>.
                                       _M_impl.super__Vector_impl_data._M_end_of_storage);
  std::_Vector_base<wasm::Type,_std::allocator<wasm::Type>_>::~_Vector_base
            ((_Vector_base<wasm::Type,_std::allocator<wasm::Type>_> *)
             &typeList.super__Vector_base<wasm::Type,_std::allocator<wasm::Type>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage);
  std::_Vector_base<wasm::Type,_std::allocator<wasm::Type>_>::~_Vector_base
            ((_Vector_base<wasm::Type,_std::allocator<wasm::Type>_> *)local_58);
  return TVar2.id;
}

Assistant:

BinaryenType TypeBuilderGetTempTupleType(TypeBuilderRef builder,
                                         BinaryenType* types,
                                         BinaryenIndex numTypes) {
  TypeList typeList(numTypes);
  for (BinaryenIndex cur = 0; cur < numTypes; ++cur) {
    typeList[cur] = Type(types[cur]);
  }
  return ((TypeBuilder*)builder)->getTempTupleType(Tuple(typeList)).getID();
}